

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigs.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  int __fd;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  size_t sVar5;
  ssize_t sVar6;
  char *pcVar7;
  undefined8 extraout_RDX;
  int sock;
  ulong uVar8;
  long lVar9;
  cmdCmd_t cmd;
  cmdCtlParse_t ctl;
  uintptr_t p [10];
  cmdScript_t s;
  char v [65536];
  int aiStack_100d0 [2];
  undefined4 uStack_100c8;
  int iStack_100c4;
  cmdCtlParse_t cStack_100c0;
  int iStack_100b8;
  undefined4 uStack_100b4;
  undefined4 uStack_100a8;
  int iStack_100a0;
  undefined4 uStack_1009c;
  cmdScript_t cStack_10068;
  undefined1 auStack_10038 [16];
  undefined1 auStack_10028 [16];
  undefined1 auStack_10018 [16];
  
  pcVar3 = getenv("PIGPIO_PORT");
  pcVar7 = "8888";
  if (pcVar3 != (char *)0x0) {
    pcVar7 = pcVar3;
  }
  pcVar4 = getenv("PIGPIO_ADDR");
  pcVar3 = "localhost";
  if (pcVar4 != (char *)0x0) {
    pcVar3 = pcVar4;
  }
  auStack_10028 = (undefined1  [16])0x0;
  auStack_10018 = (undefined1  [16])0x0;
  auStack_10038._0_12_ = ZEXT412(1) << 0x40;
  auStack_10038._12_4_ = 0;
  auStack_10038._4_8_ = auStack_10038._4_8_;
  auStack_10038._0_4_ = 2;
  iVar1 = getaddrinfo(pcVar3,pcVar7,(addrinfo *)auStack_10038,(addrinfo **)&iStack_100b8);
  __fd = -1;
  if (iVar1 == 0) {
    for (lVar9 = CONCAT44(uStack_100b4,iStack_100b8); lVar9 != 0; lVar9 = *(long *)(lVar9 + 0x28)) {
      __fd = socket(*(int *)(lVar9 + 4),*(int *)(lVar9 + 8),*(int *)(lVar9 + 0xc));
      if ((__fd != -1) &&
         (iVar1 = connect(__fd,*(sockaddr **)(lVar9 + 0x18),*(socklen_t *)(lVar9 + 0x10)),
         iVar1 != -1)) goto LAB_0010390e;
    }
    __fd = -1;
LAB_0010390e:
    freeaddrinfo((addrinfo *)CONCAT44(uStack_100b4,iStack_100b8));
  }
  _opterr = 0;
  uVar8 = 1;
  do {
    iVar1 = getopt(argc,argv,"ax");
    if (iVar1 == 0x61) {
      printFlags._0_1_ = (byte)printFlags | 2;
    }
    else if (iVar1 == 0x78) {
      printFlags._0_1_ = (byte)printFlags | 1;
    }
    else {
      if (iVar1 == -1) {
        command_buf[0] = '\0';
        iVar1 = 0;
        if ((int)uVar8 < argc) {
          lVar9 = 0;
          iVar1 = 0;
          do {
            pcVar7 = argv[uVar8];
            sVar5 = strlen(pcVar7);
            lVar9 = (long)(int)lVar9 + sVar5 + 1;
            if ((short)((ulong)lVar9 >> 0x10) == 0) {
              sprintf(command_buf + iVar1,"%s ",pcVar7);
              iVar1 = (int)lVar9;
            }
            uVar8 = uVar8 + 1;
          } while ((uint)argc != uVar8);
        }
        if (iVar1 != 0) {
          response_buf[(long)iVar1 + 0xffff] = '\0';
        }
        cStack_100c0.eaten = 0;
        sVar5 = strlen(command_buf);
        if (0 < (int)sVar5) {
          do {
            uVar2 = cmdParse(command_buf,(uintptr_t *)&iStack_100b8,0x10000,auStack_10038,
                             &cStack_100c0);
            iVar1 = iStack_100b8;
            if ((int)uVar2 < 0) {
              pcVar7 = cmdStr();
              if (uVar2 == 0xffffffff) {
                pcVar3 = "%s? unknown command, pigs h for help";
              }
              else {
                pcVar3 = "%s: bad parameter, pigs h for help";
              }
              report(0xfd,pcVar3,pcVar7);
            }
            else if (iStack_100b8 < 800) {
              if (iStack_100b8 == 0x30) {
                cmdParseScript(auStack_10038,&cStack_10068,1);
                if (cStack_10068.par != (int *)0x0) {
                  free(cStack_10068.par);
                }
              }
              else if (iStack_100b8 == 0x19) {
                printf("%s",cmdUsage);
              }
              else {
                aiStack_100d0[0] = iStack_100b8;
                uStack_100c8 = uStack_100a8;
                iStack_100c4 = iStack_100a0;
                if (__fd == -1) {
                  main_cold_4();
                }
                else {
                  sVar6 = send(__fd,aiStack_100d0,0x10,0);
                  if (sVar6 == 0x10) {
                    if (CONCAT44(uStack_1009c,iStack_100a0) != 0) {
                      send(__fd,auStack_10038,CONCAT44(uStack_1009c,iStack_100a0),0);
                    }
                    sVar6 = recv(__fd,aiStack_100d0,0x10,0x100);
                    if (sVar6 == 0x10) {
                      sock = __fd;
                      get_extensions(__fd,iVar1,iStack_100c4);
                      cmd.field_3.p3 = iStack_100c4;
                      cmd.p2 = uStack_100c8;
                      cmd.cmd = (int)extraout_RDX;
                      cmd.p1 = (int)((ulong)extraout_RDX >> 0x20);
                      print_result(sock,cmdInfo[uVar2].rv,cmd);
                    }
                    else {
                      main_cold_3();
                    }
                  }
                  else {
                    main_cold_2();
                  }
                }
              }
            }
            else {
              main_cold_1();
            }
          } while ((-1 < (int)uVar2) && (cStack_100c0.eaten < (int)sVar5));
        }
        if (-1 < __fd) {
          close(__fd);
        }
        return status;
      }
      main_cold_5();
    }
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

int main(int argc , char *argv[])
{
   int sock, command;
   int args, idx, i, pp, l, len;
   cmdCmd_t cmd;
   uintptr_t p[CMD_P_ARR];
   cmdCtlParse_t ctl;
   cmdScript_t s;
   char v[CMD_MAX_EXTENSION];

   sock = openSocket();

   args = initOpts(argc, argv);

   command_buf[0] = 0;
   l = 0;
   pp = 0;

   for (i=args; i<argc; i++)
   {
      l += (strlen(argv[i]) + 1);
      if (l < sizeof(command_buf))
         {sprintf(command_buf+pp, "%s ", argv[i]); pp=l;}
   }

   if (pp) {command_buf[--pp] = 0;}

   ctl.eaten = 0;

   len = strlen(command_buf);
   idx = 0;

   while ((idx >= 0) && (ctl.eaten < len))
   {
      if ((idx=cmdParse(command_buf, p, CMD_MAX_EXTENSION, v, &ctl)) >= 0)
      {
         command = p[0];

         if (command < PI_CMD_SCRIPT)
         {
            if (command == PI_CMD_HELP)
            {
               printf("%s", cmdUsage);
            }
            else if (command == PI_CMD_PARSE)
            {
               cmdParseScript(v, &s, 1);
               if (s.par) free (s.par);
            }
            else
            {
               cmd.cmd = command;
               cmd.p1 = p[1];
               cmd.p2 = p[2];
               cmd.p3 = p[3];

               if (sock != SOCKET_OPEN_FAILED)
               {
                  if (send(sock, &cmd, sizeof(cmdCmd_t), 0) ==
                     sizeof(cmdCmd_t))
                  {
                     if (p[3]) send(sock, v, p[3], 0); /* send extensions */

                     if (recv(sock, &cmd, sizeof(cmdCmd_t), MSG_WAITALL) ==
                        sizeof(cmdCmd_t))
                     {
                        get_extensions(sock, command, cmd.res);

                        print_result(sock, cmdInfo[idx].rv, cmd);
                     }
                     else report(PIGS_CONNECT_ERR, "socket receive failed");
                  }
                  else report(PIGS_CONNECT_ERR, "socket send failed");
               }
               else report(PIGS_CONNECT_ERR, "socket connect failed");
            }
         }
         else report(PIGS_SCRIPT_ERR,
                 "%s only allowed within a script", cmdInfo[idx].name);
      }
      else
      {
         if (idx == CMD_UNKNOWN_CMD)
            report(PIGS_SCRIPT_ERR,
               "%s? unknown command, pigs h for help", cmdStr());
         else
            report(PIGS_SCRIPT_ERR,
               "%s: bad parameter, pigs h for help", cmdStr());
      }
   }

   if (sock >= 0) close(sock);

   return status;
}